

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::RegisterTests
          (ParameterizedTestSuiteInfo<BloatyOutputTest> *this)

{
  ParamNameGeneratorFunc *pPVar1;
  TestMetaFactoryBase<BloatyTestEntry> *pTVar2;
  ParameterizedTestSuiteInfo<BloatyOutputTest> *pPVar3;
  _Alloc_hider test_suite_name_00;
  _Alloc_hider value_param;
  _Alloc_hider name;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar9;
  size_type sVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  SetUpTearDownSuiteFuncType set_up_tc;
  SetUpTearDownSuiteFuncType tear_down_tc;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  pointer __lhs;
  __shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
  *p_Var11;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<BloatyTestEntry>_*,_false> local_270;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_268;
  ParameterizedTestSuiteInfo<BloatyOutputTest> *local_260;
  char *local_258;
  shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo> test_info;
  size_t local_240;
  ParamGenerator<BloatyTestEntry> generator;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string local_1b8;
  string param_name;
  TestParamInfo<BloatyTestEntry> local_178;
  CodeLocation local_f8;
  CodeLocation local_d0;
  BloatyTestEntry local_a8;
  
  bVar5 = false;
  local_260 = this;
  for (p_Var11 = &((this->tests_).
                   super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      ; pPVar3 = local_260,
      p_Var11 !=
      &((local_260->tests_).
        super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      ; p_Var11 = p_Var11 + 1) {
    std::
    __shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&test_info.
                    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                   ,p_Var11);
    for (__lhs = (pPVar3->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __lhs != (local_260->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
      (*__lhs->generator)(&generator);
      pPVar1 = __lhs->name_func;
      local_258 = __lhs->file;
      iVar8 = __lhs->line;
      test_suite_name._M_dataplus._M_p = (pointer)&test_suite_name.field_2;
      test_suite_name._M_string_length = 0;
      test_suite_name.field_2._M_local_buf[0] = '\0';
      if ((__lhs->name)._M_string_length != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_178,&__lhs->name,"/");
        std::__cxx11::string::operator=((string *)&test_suite_name,(string *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
      }
      std::__cxx11::string::append((string *)&test_suite_name);
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &test_param_names._M_t._M_impl.super__Rb_tree_header._M_header;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           test_param_names._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar6 = (*(generator.impl_.
                 super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BloatyTestEntry>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_ParamGeneratorInterface[2])();
      local_270._M_head_impl =
           (ParamIteratorInterface<BloatyTestEntry> *)CONCAT44(extraout_var,iVar6);
      local_240 = 0;
      while( true ) {
        iVar6 = (*(generator.impl_.
                   super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BloatyTestEntry>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ParamGeneratorInterface[3])();
        local_178.param.name._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_00,iVar6);
        bVar4 = ParamIterator<BloatyTestEntry>::operator!=
                          ((ParamIterator<BloatyTestEntry> *)&local_270,
                           (ParamIterator<BloatyTestEntry> *)&local_178);
        if ((long *)local_178.param.name._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_178.param.name._M_dataplus._M_p + 8))();
        }
        if (!bVar4) break;
        Message::Message((Message *)&local_268);
        iVar6 = (*(local_270._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        BloatyTestEntry::BloatyTestEntry
                  (&local_178.param,(BloatyTestEntry *)CONCAT44(extraout_var_01,iVar6));
        local_178.index = local_240;
        (*pPVar1)(&param_name,&local_178);
        BloatyTestEntry::~BloatyTestEntry(&local_178.param);
        bVar5 = IsValidParamName(&param_name);
        pPVar3 = local_260;
        bVar5 = IsTrue(bVar5);
        if (!bVar5) {
          GTestLog::GTestLog((GTestLog *)&local_178,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x23d);
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "Condition IsValidParamName(param_name) failed. ");
          poVar9 = std::operator<<(poVar9,"Parameterized test name \'");
          poVar9 = std::operator<<(poVar9,(string *)&param_name);
          poVar9 = std::operator<<(poVar9,"\' is invalid, in ");
          poVar9 = std::operator<<(poVar9,local_258);
          poVar9 = std::operator<<(poVar9," line ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
          std::endl<char,std::char_traits<char>>(poVar9);
          GTestLog::~GTestLog((GTestLog *)&local_178);
        }
        sVar10 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(&test_param_names,&param_name);
        bVar5 = IsTrue(sVar10 == 0);
        if (!bVar5) {
          GTestLog::GTestLog((GTestLog *)&local_178,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                             ,0x242);
          poVar9 = std::operator<<((ostream *)&std::cerr,
                                   "Condition test_param_names.count(param_name) == 0 failed. ");
          poVar9 = std::operator<<(poVar9,"Duplicate parameterized test name \'");
          poVar9 = std::operator<<(poVar9,(string *)&param_name);
          poVar9 = std::operator<<(poVar9,"\', in ");
          poVar9 = std::operator<<(poVar9,local_258);
          poVar9 = std::operator<<(poVar9," line ");
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar8);
          std::endl<char,std::char_traits<char>>(poVar9);
          GTestLog::~GTestLog((GTestLog *)&local_178);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&test_param_names,&param_name);
        if (((test_info.
              super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->test_base_name)._M_string_length != 0) {
          std::operator<<((ostream *)(local_268._M_head_impl + 0x10),
                          (string *)
                          &(test_info.
                            super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->test_base_name);
          std::operator<<((ostream *)(local_268._M_head_impl + 0x10),"/");
        }
        std::operator<<((ostream *)(local_268._M_head_impl + 0x10),(string *)&param_name);
        test_suite_name_00 = test_suite_name._M_dataplus;
        Message::GetString_abi_cxx11_((string *)&local_178,(Message *)&local_268);
        name._M_p = local_178.param.name._M_dataplus._M_p;
        iVar6 = (*(local_270._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        PrintToString<BloatyTestEntry>
                  (&local_1b8,(BloatyTestEntry *)CONCAT44(extraout_var_02,iVar6));
        value_param._M_p = local_1b8._M_dataplus._M_p;
        CodeLocation::CodeLocation
                  (&local_d0,
                   &(test_info.
                     super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->code_location);
        iVar6 = (*(pPVar3->super_ParameterizedTestSuiteInfoBase).
                  _vptr_ParameterizedTestSuiteInfoBase[3])(pPVar3);
        set_up_tc = SuiteApiResolver<BloatyOutputTest>::GetSetUpCaseOrSuite(local_258,iVar8);
        tear_down_tc = SuiteApiResolver<BloatyOutputTest>::GetTearDownCaseOrSuite(local_258,iVar8);
        pTVar2 = ((test_info.
                   super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<BloatyTestEntry>,_std::default_delete<testing::internal::TestMetaFactoryBase<BloatyTestEntry>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<BloatyTestEntry>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<BloatyTestEntry>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<BloatyTestEntry>_*,_false>
                 ._M_head_impl;
        iVar7 = (*(local_270._M_head_impl)->_vptr_ParamIteratorInterface[5])();
        BloatyTestEntry::BloatyTestEntry
                  (&local_a8,(BloatyTestEntry *)CONCAT44(extraout_var_04,iVar7));
        iVar7 = (*pTVar2->_vptr_TestMetaFactoryBase[2])(pTVar2,&local_a8);
        MakeAndRegisterTestInfo
                  (test_suite_name_00._M_p,name._M_p,(char *)0x0,value_param._M_p,&local_d0,
                   (TypeId)CONCAT44(extraout_var_03,iVar6),set_up_tc,tear_down_tc,
                   (TestFactoryBase *)CONCAT44(extraout_var_05,iVar7));
        BloatyTestEntry::~BloatyTestEntry(&local_a8);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&param_name);
        if (local_268._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_268._M_head_impl + 8))();
        }
        (*(local_270._M_head_impl)->_vptr_ParamIteratorInterface[3])();
        local_240 = local_240 + 1;
        bVar5 = true;
      }
      if (local_270._M_head_impl != (ParamIteratorInterface<BloatyTestEntry> *)0x0) {
        (*(local_270._M_head_impl)->_vptr_ParamIteratorInterface[1])();
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&test_param_names._M_t);
      std::__cxx11::string::~string((string *)&test_suite_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&generator.impl_.
                  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<BloatyTestEntry>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&test_info.
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  if (!bVar5) {
    iVar8 = (*(local_260->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
              [2])(local_260);
    CodeLocation::CodeLocation(&local_f8,&pPVar3->code_location_);
    InsertSyntheticTestCase
              ((string *)CONCAT44(extraout_var_06,iVar8),&local_f8,
               (pPVar3->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (pPVar3->tests_).
               super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<BloatyOutputTest>::TestInfo>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin(); gen_it != instantiations_.end();
               ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if ( !instantiation_name.empty() )
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name = name_func(
              TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file
              << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name
              << "', in " << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }  // for gen_it
    }  // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }